

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O1

void __thiscall EvalString::AddText(EvalString *this,StringPiece text)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>
  local_40;
  
  pcVar3 = text.str_;
  ppVar2 = (this->parsed_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->parsed_).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
       ._M_impl.super__Vector_impl_data._M_start != ppVar2) && (ppVar2[-1].second == RAW)) {
    std::__cxx11::string::append((char *)(ppVar2 + -1),(ulong)pcVar3);
    return;
  }
  local_60 = &local_50;
  if (text.len_ == 0) {
    local_58 = 0;
    local_50._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar3,pcVar3 + text.len_);
  }
  paVar1 = &local_40.first.field_2;
  if (local_60 == &local_50) {
    local_40.first.field_2._8_8_ = local_50._8_8_;
    local_40.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_40.first._M_dataplus._M_p = (pointer)local_60;
  }
  local_40.first.field_2._M_allocated_capacity._1_7_ = local_50._M_allocated_capacity._1_7_;
  local_40.first.field_2._M_local_buf[0] = local_50._M_local_buf[0];
  local_40.first._M_string_length = local_58;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40.second = RAW;
  local_60 = &local_50;
  std::
  vector<std::pair<std::__cxx11::string,EvalString::TokenType>,std::allocator<std::pair<std::__cxx11::string,EvalString::TokenType>>>
  ::emplace_back<std::pair<std::__cxx11::string,EvalString::TokenType>>
            ((vector<std::pair<std::__cxx11::string,EvalString::TokenType>,std::allocator<std::pair<std::__cxx11::string,EvalString::TokenType>>>
              *)this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

void EvalString::AddText(StringPiece text) {
  // Add it to the end of an existing RAW token if possible.
  if (!parsed_.empty() && parsed_.back().second == RAW) {
    parsed_.back().first.append(text.str_, text.len_);
  } else {
    parsed_.push_back(make_pair(text.AsString(), RAW));
  }
}